

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.c
# Opt level: O3

int proxy_log_select_medium(proxy_handle *ph,LOG_MEDIUM medium,char *target)

{
  int iVar1;
  log_handle *log;
  
  log = (log_handle *)((long)ph->priv + 0x860);
  iVar1 = log_select_medium(log,medium,target);
  if (iVar1 == 0 && medium != LOG_MEDIUM_NONE) {
    log_ident(log);
  }
  return iVar1;
}

Assistant:

int proxy_log_select_medium(struct proxy_handle *ph, enum LOG_MEDIUM medium,
			    const char *target)
{
	struct proxy_priv *priv = ph->priv;
	int ret;

	ret = log_select_medium(&priv->log, medium, target);
	if (medium != LOG_MEDIUM_NONE && ret == 0)
		log_ident(&priv->log);

	return ret;
}